

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_vepu2_v2.c
# Opt level: O3

MPP_RET hal_vp8e_vepu2_init_v2(void *hal,MppEncHalCfg *cfg)

{
  MPP_RET MVar1;
  void *pvVar2;
  
  *(MppEncCfgSet **)((long)hal + 0x70) = cfg->cfg;
  cfg->type = VPU_CLIENT_VEPU2;
  MVar1 = mpp_dev_init(&cfg->dev,VPU_CLIENT_VEPU2);
  if (MVar1 == MPP_OK) {
    *(MppDev *)((long)hal + 0x50) = cfg->dev;
    if (((byte)vp8e_hal_debug & 1) != 0) {
      _mpp_log_l(4,"hal_vp8e_vepu2_v2","mpp_dev_init success.\n",(char *)0x0);
    }
    pvVar2 = mpp_osal_calloc("hal_vp8e_vepu2_init_v2",0x60);
    *(void **)((long)hal + 0x60) = pvVar2;
    if (pvVar2 == (void *)0x0) {
      _mpp_log_l(2,"hal_vp8e_vepu2_v2","failed to malloc buffers",(char *)0x0);
      MVar1 = MPP_ERR_NOMEM;
    }
    else {
      MVar1 = MPP_OK;
      *(undefined4 *)((long)hal + 0x6924) = 0;
      *(undefined4 *)((long)hal + 0x6898) = 0;
      *(undefined8 *)((long)hal + 0x690c) = 0;
      *(undefined8 *)((long)hal + 0x6914) = 0;
      *(undefined4 *)((long)hal + 0x691c) = 0;
      *(undefined4 *)((long)hal + 0x68) = 0xb8;
      *(undefined4 *)((long)hal + 0x160) = 0;
      *(undefined4 *)((long)hal + 0x16c) = 0;
      *(undefined4 *)((long)hal + 0x1ec) = 0;
      *(undefined4 *)((long)hal + 0x1b8) = 0;
      *(undefined4 *)((long)hal + 0x1d4) = 0;
      *(undefined4 *)((long)hal + 0x1dc) = 0;
      *(undefined4 *)((long)hal + 0x1e4) = 0;
      hal_vp8e_init_qp_table(hal);
    }
  }
  else {
    _mpp_log_l(2,"hal_vp8e_vepu2_v2","mpp_dev_init failed. ret: %d\n","hal_vp8e_vepu2_init_v2",
               (ulong)(uint)MVar1);
  }
  return MVar1;
}

Assistant:

static MPP_RET hal_vp8e_vepu2_init_v2(void *hal, MppEncHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;
    Vp8eHwCfg *hw_cfg = &ctx->hw_cfg;

    ctx->cfg = cfg->cfg;

    /* update output to MppEnc */
    cfg->type = VPU_CLIENT_VEPU2;
    ret = mpp_dev_init(&cfg->dev, cfg->type);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        return ret;
    }
    ctx->dev = cfg->dev;

    vp8e_hal_dbg(VP8E_DBG_HAL_FUNCTION, "mpp_dev_init success.\n");

    ctx->buffers = mpp_calloc(Vp8eVpuBuf, 1);
    if (ctx->buffers == NULL) {
        mpp_err("failed to malloc buffers");
        return MPP_ERR_NOMEM;
    }
    //memset(ctx->buffers, 0, sizeof(Vp8eVpuBuf));

    ctx->buffer_ready = 0;
    ctx->frame_cnt = 0;
    ctx->frame_type = VP8E_FRM_KEY;
    ctx->prev_frame_lost = 0;
    ctx->frame_size = 0;
    ctx->ivf_hdr_rdy = 0;
    ctx->reg_size = SWREG_AMOUNT_VEPU2;

    hw_cfg->irq_disable = 0;

    hw_cfg->rounding_ctrl  = 0;
    hw_cfg->cp_distance_mbs = 0;
    hw_cfg->recon_img_id  = 0;
    hw_cfg->input_lum_base  = 0;
    hw_cfg->input_cb_base   = 0;
    hw_cfg->input_cr_base   = 0;

    hal_vp8e_init_qp_table(hal);

    return ret;
}